

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

Vec4 __thiscall
tcu::Texture1DArrayView::sample(Texture1DArrayView *this,Sampler *sampler,float s,float t,float lod)

{
  WrapMode WVar1;
  undefined4 numLevels;
  int in_EDX;
  Vec4 VVar2;
  
  numLevels = sampler->wrapR;
  WVar1 = sampler->wrapS;
  selectLayer((Texture1DArrayView *)sampler,t);
  VVar2 = sampleLevelArray1D((ConstPixelBufferAccess *)this,numLevels,(Sampler *)(ulong)WVar1,s,
                             in_EDX,lod);
  return (Vec4)VVar2.m_data;
}

Assistant:

Vec4 Texture1DArrayView::sample (const Sampler& sampler, float s, float t, float lod) const
{
	return sampleLevelArray1D(m_levels, m_numLevels, sampler, s, selectLayer(t), lod);
}